

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bp_osd.cpp
# Opt level: O1

char * __thiscall bp_osd::osd_post_process(bp_osd *this,double *soft_decisions,char *synd)

{
  uint uVar1;
  ostream *poVar2;
  
  uVar1 = this->osd_method;
  if (uVar1 < 2) {
    osd_w(this->H,synd,this->osd0_decoding,this->osdw_decoding,soft_decisions,this->osd_order,
          this->rank,this->osd_w_encoding_inputs,(int)this->encoding_input_count);
  }
  else if (uVar1 == 2) {
    osd_0(this->H,synd,this->osd0_decoding,soft_decisions,this->rank);
    this->osdw_decoding = this->osd0_decoding;
  }
  else {
    if (uVar1 != 3) {
      poVar2 = std::operator<<((ostream *)&std::cout,
                               "ERROR. <Function bp_osd::osd_post_process>. Invalid OSD method! Method: "
                              );
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,this->osd_method);
      std::endl<char,std::char_traits<char>>(poVar2);
      exit(0x16);
    }
    osd_g(this->H,synd,this->osd0_decoding,this->osdw_decoding,soft_decisions,this->osd_order,
          this->rank);
  }
  return this->osdw_decoding;
}

Assistant:

char *bp_osd::osd_post_process(double *soft_decisions, char *synd){

    if((osd_method==0)||(osd_method==1))
        osd_w(
                H,
                synd,
                osd0_decoding,
                osdw_decoding,
                soft_decisions,
                osd_order, rank,
                osd_w_encoding_inputs,
                encoding_input_count
        );

    else if(osd_method==2){
        osd_0(
                H,
                synd,
                osd0_decoding,
                soft_decisions,
                rank
        );
        osdw_decoding=osd0_decoding;
    }

    else if(osd_method==3){
        osd_g(
                H,
                synd,
                osd0_decoding,
                osdw_decoding,
                soft_decisions,
                osd_order,
                rank
        );
    }

    else {
        cout << "ERROR. <Function bp_osd::osd_post_process>. Invalid OSD method! Method: "<<osd_method << endl;
        exit(22);
    }

    return osdw_decoding;

}